

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# send_functions.hpp
# Opt level: O1

void so_5::impl::instantiator_and_sender_base<so_5::stats::messages::quantity<unsigned_long>,false>
     ::send<so_5::stats::prefix_t,so_5::stats::suffix_t,unsigned_long&>
               (mbox_t *to,prefix_t *args,suffix_t *args_1,unsigned_long *args_2)

{
  atomic_refcounted_t *paVar1;
  abstract_message_box_t *paVar2;
  pointer *__ptr;
  quantity<unsigned_long> *local_28;
  quantity<unsigned_long> *local_20;
  pointer_____offset_0x10___ *local_18;
  
  paVar2 = to->m_obj;
  details::make_message_instance_impl<false,so_5::stats::messages::quantity<unsigned_long>>::
  make<so_5::stats::prefix_t,so_5::stats::suffix_t,unsigned_long&>
            ((make_message_instance_impl<false,so_5::stats::messages::quantity<unsigned_long>> *)
             &local_28,args,args_1,args_2);
  local_18 = &stats::messages::quantity<unsigned_long>::typeinfo;
  ensure_message_with_actual_data<so_5::stats::messages::quantity<unsigned_long>>(local_28);
  (*(local_28->super_message_t)._vptr_message_t[4])(local_28,0);
  local_20 = local_28;
  local_28 = (quantity<unsigned_long> *)0x0;
  if (local_20 != (quantity<unsigned_long> *)0x0) {
    LOCK();
    paVar1 = &(local_20->super_message_t).super_atomic_refcounted_t;
    (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i =
         (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
  }
  (*paVar2->_vptr_abstract_message_box_t[7])(paVar2,&local_18,&local_20,1);
  if (local_20 != (quantity<unsigned_long> *)0x0) {
    LOCK();
    paVar1 = &(local_20->super_message_t).super_atomic_refcounted_t;
    (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i =
         (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i - 1;
    UNLOCK();
    if (((paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i == 0) &&
       (local_20 != (quantity<unsigned_long> *)0x0)) {
      (*(local_20->super_message_t)._vptr_message_t[1])();
    }
    local_20 = (quantity<unsigned_long> *)0x0;
  }
  if (local_28 != (quantity<unsigned_long> *)0x0) {
    (**(code **)(*(long *)local_28 + 8))();
  }
  return;
}

Assistant:

void
send( TARGET && to, ARGS&&... args )
	{
		so_5::impl::instantiator_and_sender< MESSAGE >::send(
				send_functions_details::arg_to_mbox( std::forward<TARGET>(to) ),
				std::forward<ARGS>(args)... );
	}